

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BasicResult<Catch::clara::detail::ParseState> *
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::
ok<Catch::clara::detail::ParseState>
          (BasicResult<Catch::clara::detail::ParseState> *__return_storage_ptr__,ParseState *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase
  .m_type = Ok;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001838e0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.m_value.
  m_type = value->m_type;
  pbVar1 = (value->m_remainingTokens).itEnd._M_current;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.m_value.
  m_remainingTokens.it._M_current = (value->m_remainingTokens).it._M_current;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.m_value.
  m_remainingTokens.itEnd._M_current = pbVar1;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (&(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
              field_0.m_value.m_remainingTokens.m_tokenBuffer,
             &(value->m_remainingTokens).m_tokenBuffer);
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase
  ._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00183888;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static auto ok( U const &value ) -> BasicResult { return { ResultBase::Ok, value }; }